

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.c
# Opt level: O3

Filename * conf_get_filename(Conf *conf,int primary)

{
  void *pvVar1;
  key key;
  int local_10 [4];
  
  if (subkeytypes[primary] != 0) {
    __assert_fail("subkeytypes[primary] == TYPE_NONE",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",
                  0x181,"Filename *conf_get_filename(Conf *, int)");
  }
  if (valuetypes[primary] == 4) {
    local_10[0] = primary;
    pvVar1 = find234(conf->tree,local_10,(cmpfn234_conflict)0x0);
    if (pvVar1 != (void *)0x0) {
      return *(Filename **)((long)pvVar1 + 0x10);
    }
    __assert_fail("entry",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",
                  0x185,"Filename *conf_get_filename(Conf *, int)");
  }
  __assert_fail("valuetypes[primary] == TYPE_FILENAME",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",
                0x182,"Filename *conf_get_filename(Conf *, int)");
}

Assistant:

Filename *conf_get_filename(Conf *conf, int primary)
{
    struct key key;
    struct conf_entry *entry;

    assert(subkeytypes[primary] == TYPE_NONE);
    assert(valuetypes[primary] == TYPE_FILENAME);
    key.primary = primary;
    entry = find234(conf->tree, &key, NULL);
    assert(entry);
    return entry->value.u.fileval;
}